

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall Log::Add(Log *this,string *message)

{
  _func_void_string *p_Var1;
  string in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_58,&this->_logText,"\n");
  std::operator+(&local_38,&local_58,message);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  p_Var1 = this->_printFunction;
  if (p_Var1 != (_func_void_string *)0x0) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff88,(string *)message);
    (*p_Var1)(in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  return;
}

Assistant:

void Log::Add(string message) {
  _logText + "\n" + message;
  if (_printFunction != nullptr) {
    _printFunction(message);
  }
}